

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

bool __thiscall
cmQtAutoGenInitializer::GetQtExecutable
          (cmQtAutoGenInitializer *this,GenVarsT *genVars,string *executable,
          bool ignoreMissingTarget)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
  *this_00;
  pointer pcVar1;
  pointer pbVar2;
  cmLocalGenerator *lg;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  string *psVar4;
  key_type *pkVar5;
  ConfigString *pCVar6;
  ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_> *pCVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  bool bVar12;
  string *psVar13;
  cmake *cmakeInstance;
  mapped_type *pmVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  mapped_type *pmVar16;
  cmGeneratorTarget *this_01;
  uint uVar17;
  undefined7 in_register_00000009;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  key_type *__k;
  byte bVar18;
  GenVarsT *pGVar19;
  pointer pbVar20;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  string prop;
  cmGeneratorExpression ge;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmListFileBacktrace lfbt;
  bool local_184;
  string local_178;
  string local_158;
  GenVarsT *local_138;
  undefined4 local_12c;
  undefined1 local_128 [32];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_e8;
  size_type local_b0;
  char *local_a8;
  undefined8 local_a0;
  element_type *local_98;
  cmake *local_90;
  undefined8 local_88;
  cmListFileBacktrace local_78;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_12c = (undefined4)CONCAT71(in_register_00000009,ignoreMissingTarget);
  local_f8._0_8_ = (genVars->GenNameUpper)._M_len;
  local_f8._8_8_ = (genVars->GenNameUpper)._M_str;
  local_e8._M_buckets = (__buckets_ptr)0x0;
  local_e8._M_bucket_count = 0xb;
  local_e8._M_before_begin._M_nxt = (_Hash_node_base *)0x89c74a;
  local_e8._M_element_count = 0;
  views._M_len = 2;
  views._M_array = (iterator)local_f8;
  local_138 = genVars;
  local_108._8_8_ = executable;
  cmCatViews(&local_158,views);
  psVar13 = cmTarget::GetSafeProperty(this->GenTarget->Target,&local_158);
  local_58 = psVar13->_M_string_length;
  if (local_58 == 0) {
    local_184 = false;
    pGVar19 = local_138;
  }
  else {
    cmMakefile::GetBacktrace(this->Makefile);
    cmakeInstance = cmMakefile::GetCMakeInstance(this->Makefile);
    local_78.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_68;
    local_78.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = local_60;
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_60->_M_use_count = local_60->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_60->_M_use_count = local_60->_M_use_count + 1;
      }
    }
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_128,cmakeInstance,&local_78);
    if (local_78.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    pcVar1 = (psVar13->_M_dataplus)._M_p;
    local_50[0] = &local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + psVar13->_M_string_length);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_108,(string *)local_128);
    if (local_50[0] != &local_40) {
      operator_delete(local_50[0],local_40._M_allocated_capacity + 1);
    }
    if ((this->MultiConfig == true) && (this->UseBetterGraph == true)) {
      pbVar20 = (this->ConfigsList).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (this->ConfigsList).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar20 != pbVar2) {
        pCVar6 = &local_138->Executable;
        do {
          local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_e8._M_buckets = (__buckets_ptr)((ulong)local_e8._M_buckets & 0xffffffffffffff00);
          local_f8._0_8_ = &local_e8;
          cmCompiledGeneratorExpression::Evaluate
                    ((cmCompiledGeneratorExpression *)local_108._0_8_,this->LocalGen,pbVar20,
                     (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                     (cmGeneratorTarget *)0x0,(string *)local_f8);
          pmVar14 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&pCVar6->Config,pbVar20);
          std::__cxx11::string::_M_assign((string *)pmVar14);
          if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)local_f8._0_8_ != &local_e8) {
            operator_delete((void *)local_f8._0_8_,(long)local_e8._M_buckets + 1);
          }
          pbVar20 = pbVar20 + 1;
        } while (pbVar20 != pbVar2);
      }
    }
    else {
      lg = this->LocalGen;
      local_f8._0_8_ = &local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"");
      local_178._M_string_length = 0;
      local_178.field_2._M_local_buf[0] = '\0';
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      cmCompiledGeneratorExpression::Evaluate
                ((cmCompiledGeneratorExpression *)local_108._0_8_,lg,(string *)local_f8,
                 (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                 (cmGeneratorTarget *)0x0,&local_178);
      std::__cxx11::string::_M_assign((string *)&local_138->Executable);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,
                        CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                 local_178.field_2._M_local_buf[0]) + 1);
      }
      if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)local_f8._0_8_ != &local_e8) {
        operator_delete((void *)local_f8._0_8_,(long)local_e8._M_buckets + 1);
      }
    }
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_108);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_128);
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
    }
    pGVar19 = local_138;
    if (((local_138->Executable).Default._M_string_length == 0) &&
       ((local_138->Executable).Config._M_h._M_element_count == 0 && (char)local_12c == '\0')) {
      local_128._0_8_ = (cmake *)(local_128 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_128,local_158._M_dataplus._M_p,
                 local_158._M_dataplus._M_p + local_158._M_string_length);
      std::__cxx11::string::append(local_128);
      psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
      local_f8._0_8_ = (pGVar19->GenNameUpper)._M_len;
      local_f8._8_8_ = (pGVar19->GenNameUpper)._M_str;
      local_e8._M_buckets = (__buckets_ptr)0x0;
      local_e8._M_bucket_count = 0xc;
      local_e8._M_before_begin._M_nxt = (_Hash_node_base *)0x8c7934;
      local_e8._M_element_count = 0;
      local_e8._M_rehash_policy._M_next_resize = (size_t)(psVar13->_M_dataplus)._M_p;
      local_e8._M_rehash_policy._0_8_ = psVar13->_M_string_length;
      local_e8._M_single_bucket = (__node_base_ptr)0x0;
      local_b0 = 2;
      local_a8 = ": ";
      local_a0 = 0;
      local_98 = (element_type *)local_128._8_8_;
      local_90 = (cmake *)local_128._0_8_;
      local_88 = 0;
      views_00._M_len = 5;
      views_00._M_array = (iterator)local_f8;
      cmCatViews(&local_178,views_00);
      cmSystemTools::Error(&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,
                        CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                 local_178.field_2._M_local_buf[0]) + 1);
      }
      if ((cmake *)local_128._0_8_ != (cmake *)(local_128 + 0x10)) {
        operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
      }
      local_184 = false;
    }
    else if ((this->MultiConfig == true) && (this->UseBetterGraph == true)) {
      pbVar20 = (this->ConfigsList).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (this->ConfigsList).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_184 = true;
      if (pbVar20 != pbVar2) {
        pCVar7 = &local_138->ExecutableFeatures;
        do {
          p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
          p_Var15->_M_use_count = 1;
          p_Var15->_M_weak_count = 1;
          p_Var15->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b1b500;
          p_Var15[1]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var15[1]._M_use_count = 0;
          p_Var15[1]._M_weak_count = 0;
          p_Var15[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var15[2]._M_use_count = 0;
          p_Var15[2]._M_weak_count = 0;
          p_Var15[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          *(_Atomic_word **)&p_Var15[1]._M_use_count = &p_Var15[2]._M_use_count;
          p_Var15[3]._M_use_count = 0;
          p_Var15[3]._M_weak_count = 0;
          p_Var15[4]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var15[4]._M_use_count = 0;
          p_Var15[4]._M_weak_count = 0;
          pmVar16 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&pCVar7->Config,pbVar20);
          (pmVar16->super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr = (element_type *)(p_Var15 + 1);
          p_Var3 = (pmVar16->
                   super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          (pmVar16->super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi = p_Var15;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          pbVar20 = pbVar20 + 1;
          pGVar19 = local_138;
        } while (pbVar20 != pbVar2);
      }
    }
    else {
      p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
      p_Var15->_M_use_count = 1;
      p_Var15->_M_weak_count = 1;
      p_Var15->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b1b500;
      p_Var15[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var15[1]._M_use_count = 0;
      p_Var15[1]._M_weak_count = 0;
      p_Var15[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var15[2]._M_use_count = 0;
      p_Var15[2]._M_weak_count = 0;
      p_Var15[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      *(_Atomic_word **)&p_Var15[1]._M_use_count = &p_Var15[2]._M_use_count;
      p_Var15[3]._M_use_count = 0;
      p_Var15[3]._M_weak_count = 0;
      p_Var15[4]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var15[4]._M_use_count = 0;
      p_Var15[4]._M_weak_count = 0;
      (pGVar19->ExecutableFeatures).Default.
      super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(p_Var15 + 1);
      p_Var3 = (pGVar19->ExecutableFeatures).Default.
               super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (pGVar19->ExecutableFeatures).Default.
      super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var15;
      local_184 = true;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  if (local_58 == 0) {
    uVar17 = (this->QtVersion).Major - 4;
    local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_f8._0_8_ =
         (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *)0x0;
    if (uVar17 < 3) {
      local_f8._8_8_ = &DAT_00897240 + *(int *)(&DAT_00897240 + (ulong)uVar17 * 4);
      local_f8._0_8_ =
           (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            *)0x5;
    }
    local_e8._M_buckets = (__buckets_ptr)0x0;
    local_e8._M_before_begin._M_nxt =
         (_Hash_node_base *)(((cmListFileContext *)local_108._8_8_)->Name)._M_dataplus._M_p;
    local_e8._M_bucket_count = (((cmListFileContext *)local_108._8_8_)->Name)._M_string_length;
    local_e8._M_element_count = 0;
    views_01._M_len = 2;
    views_01._M_array = (iterator)local_f8;
    cmCatViews(&local_158,views_01);
    this_01 = cmLocalGenerator::FindGeneratorTargetToUse(this->LocalGen,&local_158);
    if (this_01 == (cmGeneratorTarget *)0x0) {
      if ((char)local_12c == '\0') {
        local_f8._0_8_ = (pointer)0xf;
        local_f8._8_8_ = "Could not find ";
        local_e8._M_buckets = (__buckets_ptr)0x0;
        local_e8._M_before_begin._M_nxt =
             (_Hash_node_base *)(((cmListFileContext *)local_108._8_8_)->Name)._M_dataplus._M_p;
        local_e8._M_bucket_count = (((cmListFileContext *)local_108._8_8_)->Name)._M_string_length;
        local_e8._M_element_count = 0;
        local_e8._M_rehash_policy._M_max_load_factor = 2.66247e-44;
        local_e8._M_rehash_policy._4_4_ = 0;
        local_e8._M_rehash_policy._M_next_resize = 0x8971f5;
        local_e8._M_single_bucket = (__node_base_ptr)0x0;
        local_b0 = local_158._M_string_length;
        local_a8 = local_158._M_dataplus._M_p;
        local_a0 = 0;
        views_02._M_len = 4;
        views_02._M_array = (iterator)local_f8;
        cmCatViews((string *)local_128,views_02);
        psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
        local_f8._0_8_ = (pGVar19->GenNameUpper)._M_len;
        local_f8._8_8_ = (pGVar19->GenNameUpper)._M_str;
        local_e8._M_buckets = (__buckets_ptr)0x0;
        local_e8._M_bucket_count = 0xc;
        local_e8._M_before_begin._M_nxt = (_Hash_node_base *)0x8c7934;
        local_e8._M_element_count = 0;
        local_e8._M_rehash_policy._M_next_resize = (size_t)(psVar13->_M_dataplus)._M_p;
        local_e8._M_rehash_policy._0_8_ = psVar13->_M_string_length;
        local_e8._M_single_bucket = (__node_base_ptr)0x0;
        local_b0 = 2;
        local_a8 = ": ";
        local_a0 = 0;
        local_98 = (element_type *)local_128._8_8_;
        local_90 = (cmake *)local_128._0_8_;
        local_88 = 0;
        views_03._M_len = 5;
        views_03._M_array = (iterator)local_f8;
        cmCatViews(&local_178,views_03);
        cmSystemTools::Error(&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,
                          CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                   local_178.field_2._M_local_buf[0]) + 1);
        }
        if ((cmake *)local_128._0_8_ != (cmake *)(local_128 + 0x10)) {
          operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
        }
        local_184 = false;
      }
      else if ((this->MultiConfig == true) && (this->UseBetterGraph == true)) {
        pbVar20 = (this->ConfigsList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar2 = (this->ConfigsList).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_184 = true;
        if (pbVar20 != pbVar2) {
          pCVar7 = &pGVar19->ExecutableFeatures;
          do {
            p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
            p_Var15->_M_use_count = 1;
            p_Var15->_M_weak_count = 1;
            p_Var15->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b1b500;
            p_Var15[1]._vptr__Sp_counted_base = (_func_int **)0x0;
            p_Var15[1]._M_use_count = 0;
            p_Var15[1]._M_weak_count = 0;
            p_Var15[2]._vptr__Sp_counted_base = (_func_int **)0x0;
            p_Var15[2]._M_use_count = 0;
            p_Var15[2]._M_weak_count = 0;
            p_Var15[3]._vptr__Sp_counted_base = (_func_int **)0x0;
            *(_Atomic_word **)&p_Var15[1]._M_use_count = &p_Var15[2]._M_use_count;
            p_Var15[3]._M_use_count = 0;
            p_Var15[3]._M_weak_count = 0;
            p_Var15[4]._vptr__Sp_counted_base = (_func_int **)0x0;
            p_Var15[4]._M_use_count = 0;
            p_Var15[4]._M_weak_count = 0;
            pmVar16 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&pCVar7->Config,pbVar20);
            (pmVar16->super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>)
            ._M_ptr = (element_type *)(p_Var15 + 1);
            p_Var3 = (pmVar16->
                     super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
            (pmVar16->super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>)
            ._M_refcount._M_pi = p_Var15;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
            }
            pbVar20 = pbVar20 + 1;
            pGVar19 = local_138;
          } while (pbVar20 != pbVar2);
        }
      }
      else {
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
        p_Var15->_M_use_count = 1;
        p_Var15->_M_weak_count = 1;
        p_Var15->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b1b500;
        p_Var15[1]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var15[1]._M_use_count = 0;
        p_Var15[1]._M_weak_count = 0;
        p_Var15[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var15[2]._M_use_count = 0;
        p_Var15[2]._M_weak_count = 0;
        p_Var15[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        *(_Atomic_word **)&p_Var15[1]._M_use_count = &p_Var15[2]._M_use_count;
        p_Var15[3]._M_use_count = 0;
        p_Var15[3]._M_weak_count = 0;
        p_Var15[4]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var15[4]._M_use_count = 0;
        p_Var15[4]._M_weak_count = 0;
        (pGVar19->ExecutableFeatures).Default.
        super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(p_Var15 + 1);
        p_Var3 = (pGVar19->ExecutableFeatures).Default.
                 super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        (pGVar19->ExecutableFeatures).Default.
        super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = p_Var15;
        local_184 = true;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&pGVar19->ExecutableTargetName);
      pGVar19->ExecutableTarget = this_01;
      bVar12 = cmGeneratorTarget::IsImported(this_01);
      if (bVar12) {
        if ((this->MultiConfig == false) || (this->UseBetterGraph != true)) {
          cmGeneratorTarget::ImportedGetLocation((string *)local_f8,this_01,&this->ConfigDefault);
          std::__cxx11::string::operator=((string *)&pGVar19->Executable,(string *)local_f8);
          if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)local_f8._0_8_ != &local_e8) {
            operator_delete((void *)local_f8._0_8_,(long)local_e8._M_buckets + 1);
          }
        }
        else {
          pbVar20 = (this->ConfigsList).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar2 = (this->ConfigsList).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pbVar20 != pbVar2) {
            do {
              cmGeneratorTarget::ImportedGetLocation((string *)local_f8,this_01,pbVar20);
              pmVar14 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&(pGVar19->Executable).Config,pbVar20);
              std::__cxx11::string::operator=((string *)pmVar14,(string *)local_f8);
              if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_f8._0_8_ != &local_e8) {
                operator_delete((void *)local_f8._0_8_,(long)local_e8._M_buckets + 1);
              }
              pbVar20 = pbVar20 + 1;
            } while (pbVar20 != pbVar2);
          }
        }
      }
      else if ((this->MultiConfig == false) || (this->UseBetterGraph != true)) {
        cmGeneratorTarget::GetLocation(this_01,&this->ConfigDefault);
        std::__cxx11::string::_M_assign((string *)&pGVar19->Executable);
      }
      else {
        psVar13 = (this->ConfigsList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar4 = (this->ConfigsList).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (psVar13 != psVar4) {
          do {
            cmGeneratorTarget::GetLocation(this_01,psVar13);
            pmVar14 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&(pGVar19->Executable).Config,psVar13);
            std::__cxx11::string::_M_assign((string *)pmVar14);
            psVar13 = psVar13 + 1;
          } while (psVar13 != psVar4);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                               local_158.field_2._M_local_buf[0]) + 1);
    }
    if (this_01 != (cmGeneratorTarget *)0x0) {
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      local_158._M_string_length = 0;
      local_158.field_2._M_local_buf[0] = '\0';
      cmQtAutoGenGlobalInitializer::GetCompilerFeatures
                ((ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_> *)local_f8,
                 this->GlobalInitializer,(string *)local_108._8_8_,&pGVar19->Executable,&local_158,
                 this->MultiConfig,this->UseBetterGraph);
      uVar8 = local_f8._0_4_;
      uVar9 = local_f8._4_4_;
      uVar10 = local_f8._8_4_;
      uVar11 = local_f8._12_4_;
      local_f8._0_8_ = (pointer)0x0;
      local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var3 = (pGVar19->ExecutableFeatures).Default.
               super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      *(undefined4 *)
       &(pGVar19->ExecutableFeatures).Default.
        super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar8
      ;
      *(undefined4 *)
       ((long)&(pGVar19->ExecutableFeatures).Default.
               super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       + 4) = uVar9;
      *(undefined4 *)
       &(pGVar19->ExecutableFeatures).Default.
        super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = uVar10;
      *(undefined4 *)
       ((long)&(pGVar19->ExecutableFeatures).Default.
               super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi + 4) = uVar11;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      this_00 = &(pGVar19->ExecutableFeatures).Config;
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_move_assign(&this_00->_M_h,&local_e8);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_e8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
      }
      if ((this->MultiConfig == true) && (this->UseBetterGraph == true)) {
        pkVar5 = (this->ConfigsList).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar18 = 1;
        for (__k = (this->ConfigsList).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; __k != pkVar5; __k = __k + 1) {
          pmVar16 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_00,__k);
          if (((pmVar16->
               super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               == (element_type *)0x0) &&
             (pmVar16 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)this_00,__k),
             (pmVar16->super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr == (element_type *)0x0)) {
            psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
            local_f8._0_8_ = (pGVar19->GenNameUpper)._M_len;
            local_f8._8_8_ = (pGVar19->GenNameUpper)._M_str;
            local_e8._M_buckets = (__buckets_ptr)0x0;
            local_e8._M_bucket_count = 0xc;
            local_e8._M_before_begin._M_nxt = (_Hash_node_base *)0x8c7934;
            local_e8._M_element_count = 0;
            local_e8._M_rehash_policy._M_next_resize = (size_t)(psVar13->_M_dataplus)._M_p;
            local_e8._M_rehash_policy._0_8_ = psVar13->_M_string_length;
            local_e8._M_single_bucket = (__node_base_ptr)0x0;
            local_b0 = 2;
            local_a8 = ": ";
            local_a0 = 0;
            local_98 = (element_type *)local_158._M_string_length;
            local_90 = (cmake *)local_158._M_dataplus._M_p;
            local_88 = 0;
            views_05._M_len = 5;
            views_05._M_array = (iterator)local_f8;
            cmCatViews(&local_178,views_05);
            cmSystemTools::Error(&local_178);
            goto LAB_0031bccb;
          }
        }
      }
      else {
        bVar18 = 1;
        if ((pGVar19->ExecutableFeatures).Default.
            super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
          local_f8._0_8_ = (pGVar19->GenNameUpper)._M_len;
          local_f8._8_8_ = (pGVar19->GenNameUpper)._M_str;
          local_e8._M_buckets = (__buckets_ptr)0x0;
          local_e8._M_bucket_count = 0xc;
          local_e8._M_before_begin._M_nxt = (_Hash_node_base *)0x8c7934;
          local_e8._M_element_count = 0;
          local_e8._M_rehash_policy._M_next_resize = (size_t)(psVar13->_M_dataplus)._M_p;
          local_e8._M_rehash_policy._0_8_ = psVar13->_M_string_length;
          local_e8._M_single_bucket = (__node_base_ptr)0x0;
          local_b0 = 2;
          local_a8 = ": ";
          local_a0 = 0;
          local_98 = (element_type *)local_158._M_string_length;
          local_90 = (cmake *)local_158._M_dataplus._M_p;
          local_88 = 0;
          views_04._M_len = 5;
          views_04._M_array = (iterator)local_f8;
          cmCatViews(&local_178,views_04);
          cmSystemTools::Error(&local_178);
LAB_0031bccb:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,
                            CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                     local_178.field_2._M_local_buf[0]) + 1);
          }
          bVar18 = 0;
          local_184 = false;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,
                        CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                 local_158.field_2._M_local_buf[0]) + 1);
      }
      local_184 = (bool)(bVar18 | local_184);
    }
  }
  return local_184;
}

Assistant:

bool cmQtAutoGenInitializer::GetQtExecutable(GenVarsT& genVars,
                                             const std::string& executable,
                                             bool ignoreMissingTarget) const
{
  auto print_err = [this, &genVars](std::string const& err) {
    cmSystemTools::Error(cmStrCat(genVars.GenNameUpper, " for target ",
                                  this->GenTarget->GetName(), ": ", err));
  };

  // Custom executable
  {
    std::string const prop = cmStrCat(genVars.GenNameUpper, "_EXECUTABLE");
    std::string const& val = this->GenTarget->Target->GetSafeProperty(prop);
    if (!val.empty()) {
      // Evaluate generator expression
      {
        cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
        cmGeneratorExpression ge(*this->Makefile->GetCMakeInstance(), lfbt);
        std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(val);
        if (this->MultiConfig && this->UseBetterGraph) {
          for (auto const& config : this->ConfigsList) {
            genVars.Executable.Config[config] =
              cge->Evaluate(this->LocalGen, config);
          }
        } else {
          genVars.Executable.Default = cge->Evaluate(this->LocalGen, "");
        }
      }

      if (genVars.Executable.Default.empty() &&
          genVars.Executable.Config.empty() && !ignoreMissingTarget) {
        print_err(prop + " evaluates to an empty value");
        return false;
      }

      // Create empty compiler features.
      if (this->MultiConfig && this->UseBetterGraph) {
        for (auto const& config : this->ConfigsList) {
          genVars.ExecutableFeatures.Config[config] =
            std::make_shared<cmQtAutoGen::CompilerFeatures>();
        }
      } else {
        genVars.ExecutableFeatures.Default =
          std::make_shared<cmQtAutoGen::CompilerFeatures>();
      }
      return true;
    }
  }

  // Find executable target
  {
    // Find executable target name
    cm::string_view prefix;
    if (this->QtVersion.Major == 4) {
      prefix = "Qt4::";
    } else if (this->QtVersion.Major == 5) {
      prefix = "Qt5::";
    } else if (this->QtVersion.Major == 6) {
      prefix = "Qt6::";
    }
    std::string const targetName = cmStrCat(prefix, executable);

    // Find target
    cmGeneratorTarget* genTarget =
      this->LocalGen->FindGeneratorTargetToUse(targetName);
    if (genTarget) {
      genVars.ExecutableTargetName = targetName;
      genVars.ExecutableTarget = genTarget;
      if (genTarget->IsImported()) {
        if (this->MultiConfig && this->UseBetterGraph) {
          for (auto const& config : this->ConfigsList) {
            genVars.Executable.Config[config] =
              genTarget->ImportedGetLocation(config);
          }
        } else {
          genVars.Executable.Default =
            genTarget->ImportedGetLocation(this->ConfigDefault);
        }

      } else {
        if (this->MultiConfig && this->UseBetterGraph) {
          for (auto const& config : this->ConfigsList) {
            genVars.Executable.Config[config] = genTarget->GetLocation(config);
          }
        } else {
          genVars.Executable.Default =
            genTarget->GetLocation(this->ConfigDefault);
        }
      }
    } else {
      if (ignoreMissingTarget) {
        // Create empty compiler features.
        if (this->MultiConfig && this->UseBetterGraph) {
          for (auto const& config : this->ConfigsList) {
            genVars.ExecutableFeatures.Config[config] =
              std::make_shared<cmQtAutoGen::CompilerFeatures>();
          }
        } else {
          genVars.ExecutableFeatures.Default =
            std::make_shared<cmQtAutoGen::CompilerFeatures>();
        }

        return true;
      }
      print_err(cmStrCat("Could not find ", executable, " executable target ",
                         targetName));
      return false;
    }
  }

  // Get executable features
  {
    std::string err;
    genVars.ExecutableFeatures = this->GlobalInitializer->GetCompilerFeatures(
      executable, genVars.Executable, err, this->MultiConfig,
      this->UseBetterGraph);
    if (this->MultiConfig && this->UseBetterGraph) {
      for (auto const& config : this->ConfigsList) {
        if (!genVars.ExecutableFeatures.Config[config]) {
          if (!genVars.ExecutableFeatures.Config[config]) {
            print_err(err);
            return false;
          }
        }
      }
    } else {
      if (!genVars.ExecutableFeatures.Default) {
        print_err(err);
        return false;
      }
    }
  }

  return true;
}